

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,int *value)

{
  int *piVar1;
  char cVar2;
  StreamReader *pSVar3;
  bool bVar4;
  bool bVar5;
  uint64_t pos;
  value_type_conflict2 *pvVar6;
  ostream *poVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  char sc;
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  string local_368;
  string fp_str;
  ostringstream ss_e;
  undefined7 uStack_327;
  ulong local_320;
  stringstream ss;
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pos = CurrLoc(this);
  fp_str._M_dataplus._M_p = (pointer)&fp_str.field_2;
  fp_str._M_string_length = 0;
  fp_str.field_2._M_local_buf[0] = '\0';
  bVar4 = LexFloat(this,&fp_str);
  if (bVar4) {
    anon_unknown_3::ParseDouble(&flt,&fp_str);
    if (flt.contained.
        super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value == false) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar7 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReadBasicType");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x326);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)&ss_e,"Failed to parse floating value.");
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_368);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    }
    else {
      pvVar6 = nonstd::expected_lite::
               expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(&flt);
      *value = (int)*pvVar6;
    }
    nonstd::expected_lite::
    expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~expected(&flt);
    goto LAB_002b9e11;
  }
  SeekTo(this,pos);
  bVar4 = Char1(this,&sc);
  if (bVar4) {
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    bVar4 = true;
    if ((sc == '+') || (sc == '-')) {
LAB_002b9b47:
      ::std::operator<<(local_1a0,sc);
      while( true ) {
        bVar5 = Eof(this);
        if (bVar5) break;
        bVar5 = Char1(this,(char *)&ss_e);
        if (!bVar5) goto LAB_002b9e0f;
        if (9 < (byte)((char)ss_e - 0x30U)) {
          pSVar3 = this->_sr;
          if ((0 < (long)pSVar3->idx_) && (uVar8 = pSVar3->idx_ - 1, uVar8 <= pSVar3->length_)) {
            pSVar3->idx_ = uVar8;
          }
          break;
        }
        ::std::operator<<(local_1a0,(char)ss_e);
      }
      if (!bVar4) {
LAB_002b9cb8:
        ::std::__cxx11::stringbuf::str();
        if (local_320 < 2) {
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ::std::__cxx11::stringbuf::str();
          cVar2 = *(char *)flt.contained.
                           super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0.m_value;
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (cVar2 == '0') {
            pcVar10 = "Zero padded integer value is not allowed.\n";
            goto LAB_002b9d0e;
          }
        }
        ::std::__cxx11::stringbuf::str();
        pcVar10 = (char *)CONCAT71(uStack_327,ss_e);
        if ((pcVar10 != (char *)0x0) && (cVar2 = *pcVar10, cVar2 != '\0')) {
          if ((cVar2 == '-') || (cVar2 == '+')) {
            if (local_320 == 1) goto LAB_002b9d77;
            uVar8 = 1;
          }
          else {
            uVar8 = 0;
          }
          lVar11 = 0;
          for (; uVar8 < local_320; uVar8 = uVar8 + 1) {
            if (9 < (byte)(pcVar10[uVar8] - 0x30U)) goto LAB_002b9d77;
            lVar11 = lVar11 * 10 + (ulong)(byte)(pcVar10[uVar8] - 0x30U);
            if (cVar2 == '-') {
              if (0x80000000 < lVar11) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::stringbuf::str();
                pcVar10 = "Integer underflows: `";
                goto LAB_002b9d98;
              }
            }
            else if (0x7fffffff < lVar11) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              pcVar10 = "Integer overflows: `";
              goto LAB_002b9d98;
            }
          }
          iVar9 = -(int)lVar11;
          if (cVar2 != '-') {
            iVar9 = (int)lVar11;
          }
          ::std::__cxx11::string::_M_dispose();
          *value = iVar9;
          flt.contained.
          super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          goto LAB_002b9e11;
        }
LAB_002b9d77:
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        pcVar10 = "Invalid integer input: `";
LAB_002b9d98:
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flt,
                         pcVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_368);
        pcVar10 = "`\n";
        goto LAB_002b9ddc;
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_dispose();
      if (local_320 != 1) goto LAB_002b9cb8;
      pcVar10 = "Integer value expected but got sign character only.\n";
LAB_002b9d0e:
      ::std::__cxx11::string::string((string *)&ss_e,pcVar10,(allocator *)&flt);
      PushError(this,(string *)&ss_e);
    }
    else {
      if ((byte)(sc - 0x30U) < 10) {
        bVar4 = false;
        goto LAB_002b9b47;
      }
      ::std::__cxx11::to_string(&local_368,(int)sc);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flt,
                       "Sign or 0-9 expected, but got \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_368);
      pcVar10 = "\'.\n";
LAB_002b9ddc:
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flt,
                       pcVar10);
      PushError(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::_M_dispose();
  }
LAB_002b9e0f:
  flt.contained.
  super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = false;
LAB_002b9e11:
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return flt.contained.
         super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .m_has_value;
}

Assistant:

bool AsciiParser::ReadBasicType(int *value) {
  std::stringstream ss;

  // pxrUSD allow floating-point value to `int` type.
  // so first try fp parsing.
  auto loc = CurrLoc();
  std::string fp_str;
  if (LexFloat(&fp_str)) {
    auto flt = ParseDouble(fp_str);
    if (!flt) {
      PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
    } else {
      (*value) = int(flt.value());
      return true;
    }
  }

  // revert
  SeekTo(loc);

  // head character
  bool has_sign = false;
  // bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      // negative = false;
      has_sign = true;
    } else if (sc == '-') {
      // negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

  int int_value;
  int err = parseInt(ss.str(), &int_value);
  if (err != 0) {
    if (err == -1) {
      PushError("Invalid integer input: `" + ss.str() + "`\n");
      return false;
    } else if (err == -2) {
      PushError("Integer overflows: `" + ss.str() + "`\n");
      return false;
    } else if (err == -3) {
      PushError("Integer underflows: `" + ss.str() + "`\n");
      return false;
    } else {
      PushError("Unknown parseInt error.\n");
      return false;
    }
  }

  (*value) = int_value;

  return true;
}